

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySwap.c
# Opt level: O2

void Kit_TruthCountOnesInCofs_64bit(word *pTruth,int nVars,int *pStore)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  
  bVar1 = (char)nVars - 6U & 0x1f;
  uVar8 = 1 << bVar1;
  iVar2 = (int)uVar8 / 2;
  uVar10 = 0;
  memset(pStore,0,(long)nVars * 4);
  if (nVars < 7) {
    if (0 < nVars) {
      uVar10 = *pTruth;
      iVar2 = Kit_WordCountOnes_64bit(uVar10 & 0x5555555555555555);
      *pStore = iVar2;
      if (nVars != 1) {
        iVar2 = Kit_WordCountOnes_64bit(uVar10 & 0x3333333333333333);
        pStore[1] = iVar2;
        if (2 < (uint)nVars) {
          iVar2 = Kit_WordCountOnes_64bit(uVar10 & 0xf0f0f0f0f0f0f0f);
          pStore[2] = iVar2;
          if (nVars != 3) {
            iVar2 = Kit_WordCountOnes_64bit(uVar10 & 0xff00ff00ff00ff);
            pStore[3] = iVar2;
            if (4 < (uint)nVars) {
              iVar2 = Kit_WordCountOnes_64bit(uVar10 & 0xffff0000ffff);
              pStore[4] = iVar2;
              if (nVars == 6) {
                iVar2 = Kit_WordCountOnes_64bit(uVar10 & 0xffffffff);
                pStore[5] = iVar2;
              }
            }
          }
        }
      }
    }
  }
  else {
    uVar9 = (ulong)uVar8;
    if (1 << bVar1 < 1) {
      uVar9 = uVar10;
    }
    for (; uVar10 != uVar9; uVar10 = uVar10 + 1) {
      iVar3 = Kit_WordCountOnes_64bit(pTruth[uVar10]);
      for (lVar7 = 0; (ulong)(uint)nVars - 6 != lVar7; lVar7 = lVar7 + 1) {
        if (((uint)uVar10 >> ((uint)lVar7 & 0x1f) & 1) == 0) {
          pStore[lVar7 + 6] = pStore[lVar7 + 6] + iVar3;
        }
      }
    }
    if (nVars < 7) {
      iVar2 = 0;
    }
    for (; 0 < iVar2; iVar2 = iVar2 + -1) {
      uVar10 = *pTruth;
      uVar9 = pTruth[1];
      iVar3 = Kit_WordCountOnes_64bit
                        ((uVar10 & 0x5555555555555555) + (uVar9 & 0xd555555555555555) * 2);
      iVar4 = Kit_WordCountOnes_64bit
                        ((uVar10 & 0x3333333333333333) + (uVar9 & 0xf333333333333333) * 4);
      iVar5 = Kit_WordCountOnes_64bit((uVar9 & 0xf0f0f0f0f0f0f0f) << 4 | uVar10 & 0xf0f0f0f0f0f0f0f)
      ;
      iVar6 = Kit_WordCountOnes_64bit((uVar9 & 0xff00ff00ff00ff) << 8 | uVar10 & 0xff00ff00ff00ff);
      *pStore = iVar3 + *pStore;
      pStore[1] = iVar4 + pStore[1];
      pStore[2] = iVar5 + pStore[2];
      pStore[3] = iVar6 + pStore[3];
      iVar3 = Kit_WordCountOnes_64bit((uVar9 & 0xffff0000ffff) << 0x10 | uVar10 & 0xffff0000ffff);
      pStore[4] = pStore[4] + iVar3;
      iVar3 = Kit_WordCountOnes_64bit(uVar9 << 0x20 | uVar10 & 0xffffffff);
      pStore[5] = pStore[5] + iVar3;
      pTruth = pTruth + 2;
    }
  }
  return;
}

Assistant:

void Kit_TruthCountOnesInCofs_64bit( word * pTruth, int nVars, int * pStore )
{    
    int nWords = Kit_TruthWordNum_64bit( nVars );
    int i, k, Counter;
    memset( pStore, 0, sizeof(int) * nVars );
    if ( nVars <= 6 )
    {
        if ( nVars > 0 )        
            pStore[0] = Kit_WordCountOnes_64bit( pTruth[0] & ABC_CONST(0x5555555555555555) );  
        if ( nVars > 1 )       
            pStore[1] = Kit_WordCountOnes_64bit( pTruth[0] & ABC_CONST(0x3333333333333333) );     
        if ( nVars > 2 )       
            pStore[2] = Kit_WordCountOnes_64bit( pTruth[0] & ABC_CONST(0x0F0F0F0F0F0F0F0F) );   
        if ( nVars > 3 )       
            pStore[3] = Kit_WordCountOnes_64bit( pTruth[0] & ABC_CONST(0x00FF00FF00FF00FF) );     
        if ( nVars > 4 )       
            pStore[4] = Kit_WordCountOnes_64bit( pTruth[0] & ABC_CONST(0x0000FFFF0000FFFF) ); 
        if ( nVars > 5 )       
            pStore[5] = Kit_WordCountOnes_64bit( pTruth[0] & ABC_CONST(0x00000000FFFFFFFF) );      
        return;
    }
    // nVars > 6
    // count 1's for all other variables
    for ( k = 0; k < nWords; k++ )
    {
        Counter = Kit_WordCountOnes_64bit( pTruth[k] );
        for ( i = 6; i < nVars; i++ )
            if ( (k & (1 << (i-6))) == 0)
                pStore[i] += Counter;
    }
    // count 1's for the first six variables
    for ( k = nWords/2; k>0; k-- )
    {
        pStore[0] += Kit_WordCountOnes_64bit( (pTruth[0] & ABC_CONST(0x5555555555555555)) | ((pTruth[1] & ABC_CONST(0x5555555555555555)) <<  1) );
        pStore[1] += Kit_WordCountOnes_64bit( (pTruth[0] & ABC_CONST(0x3333333333333333)) | ((pTruth[1] & ABC_CONST(0x3333333333333333)) <<  2) );
        pStore[2] += Kit_WordCountOnes_64bit( (pTruth[0] & ABC_CONST(0x0F0F0F0F0F0F0F0F)) | ((pTruth[1] & ABC_CONST(0x0F0F0F0F0F0F0F0F)) <<  4) );
        pStore[3] += Kit_WordCountOnes_64bit( (pTruth[0] & ABC_CONST(0x00FF00FF00FF00FF)) | ((pTruth[1] & ABC_CONST(0x00FF00FF00FF00FF)) <<  8) );
        pStore[4] += Kit_WordCountOnes_64bit( (pTruth[0] & ABC_CONST(0x0000FFFF0000FFFF)) | ((pTruth[1] & ABC_CONST(0x0000FFFF0000FFFF)) <<  16) );
        pStore[5] += Kit_WordCountOnes_64bit( (pTruth[0] & ABC_CONST(0x00000000FFFFFFFF)) | ((pTruth[1] & ABC_CONST(0x00000000FFFFFFFF)) <<  32) );  
        pTruth += 2;
    }
}